

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::
Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
::Maybe(Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
        *this,Maybe<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
              *other)

{
  kj::_::
  NullableValue<capnp::compiler::(anonymous_namespace)::Located<kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>_>_>
  ::NullableValue(&this->ptr,&other->ptr);
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>::~Array
              (&(other->ptr).field_1.value.value);
    return;
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }